

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                 *this,TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                       *cp)

{
  long in_RSI;
  TPZVec<int> *in_RDI;
  TPZAbstractFrontMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *copy;
  TPZStackEqnStorage<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<std::complex<long_double>,TPZStackEqnStorage<std::complex<long_double>>,TPZFrontNonSym<std::complex<long_double>>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZAbstractFrontMatrix<std::complex<long_double>_>::TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<std::complex<long_double>_> *)in_RDI,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZFrontMatrix_02545f18;
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage
            (in_stack_ffffffffffffffd0,
             (TPZStackEqnStorage<std::complex<long_double>_> *)(in_RDI + 1));
  copy = (TPZVec<int> *)&in_RDI[0x2d20].fNElements;
  TPZFrontNonSym<std::complex<long_double>_>::TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<long_double>_> *)in_RDI,
             (TPZFrontNonSym<std::complex<long_double>_> *)copy);
  in_RDI[0x2d29].fNAlloc = *(int64_t *)(in_RSI + 0x5a538);
  in_RDI[0x2d2a]._vptr_TPZVec = *(_func_int ***)(in_RSI + 0x5a540);
  TPZVec<int>::TPZVec(in_RDI,copy);
  TPZVec<int>::TPZVec(in_RDI,copy);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }